

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBinToHexConsumer(void *pIn,sxu32 nLen,ProcConsumer xConsumer,void *pConsumerData)

{
  int iVar1;
  uchar local_43;
  uchar local_42;
  sxi32 rc;
  uchar zOut [3];
  uchar *zEnd;
  uchar *zIn;
  void *pConsumerData_local;
  ProcConsumer xConsumer_local;
  sxu32 nLen_local;
  void *pIn_local;
  
  _rc = (uchar *)((long)pIn + (ulong)nLen);
  zEnd = (uchar *)pIn;
  while( true ) {
    if (_rc <= zEnd) {
      return 0;
    }
    local_43 = "0123456789abcdef"[(int)(uint)*zEnd >> 4];
    local_42 = "0123456789abcdef"[(int)(*zEnd & 0xf)];
    iVar1 = (*xConsumer)(&local_43,2,pConsumerData);
    if (iVar1 != 0) break;
    zEnd = zEnd + 1;
  }
  return iVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyBinToHexConsumer(const void *pIn, sxu32 nLen, ProcConsumer xConsumer, void *pConsumerData)
{
	static const unsigned char zHexTab[] = "0123456789abcdef";
	const unsigned char *zIn, *zEnd;
	unsigned char zOut[3];
	sxi32 rc;
#if defined(UNTRUST)
	if( pIn == 0 || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	zIn   = (const unsigned char *)pIn;
	zEnd  = &zIn[nLen];
	for(;;){
		if( zIn >= zEnd  ){
			break;
		}
		zOut[0] = zHexTab[zIn[0] >> 4];  zOut[1] = zHexTab[zIn[0] & 0x0F];
		rc = xConsumer((const void *)zOut, sizeof(char)*2, pConsumerData);
		if( rc != SXRET_OK ){
			return rc;
		}
		zIn++; 
	}
	return SXRET_OK;
}